

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

void __thiscall addrman_tests::addrman_getaddr::test_method(addrman_getaddr *this)

{
  pointer pCVar1;
  size_type *psVar2;
  long lVar3;
  _func_int **pp_Var4;
  pointer pcVar5;
  __single_object _Var6;
  bool bVar7;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  size_t sVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  pointer pCVar13;
  iterator in_R8;
  iterator pvVar14;
  iterator in_R9;
  iterator pvVar15;
  uint uVar16;
  long lVar17;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<CAddress> __l_01;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar18;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined4 local_624;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  size_t local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  size_t percent23;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  vector<CAddress,_std::allocator<CAddress>_> vAddr1;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  __single_object addrman;
  size_t *local_430;
  int octet2;
  undefined4 uStack_424;
  int octet1;
  undefined4 uStack_41c;
  char *local_418;
  direct_or_indirect local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  uint16_t local_3f0;
  NodeSeconds local_3e8;
  ServiceFlags SStack_3e0;
  direct_or_indirect local_3d8;
  uint local_3c8;
  Network local_3c0;
  uint32_t uStack_3bc;
  uint16_t local_3b8;
  vector<CAddress,_std::allocator<CAddress>_> vAddr;
  string local_390;
  direct_or_indirect local_370;
  uint local_360;
  Network local_358;
  uint32_t uStack_354;
  uint16_t local_350;
  direct_or_indirect local_348;
  uint local_338;
  Network local_330;
  uint32_t uStack_32c;
  uint16_t local_328;
  string strAddr;
  CAddress addr;
  prevector<16U,_unsigned_char,_unsigned_int,_int> local_2c8;
  Network local_2b0;
  uint32_t uStack_2ac;
  uint16_t local_2a8;
  duration local_2a0;
  ServiceFlags SStack_298;
  prevector<16U,_unsigned_char,_unsigned_int,_int> local_290;
  Network local_278;
  uint32_t uStack_274;
  uint16_t local_270;
  duration local_268;
  ServiceFlags SStack_260;
  CNetAddr source2;
  CNetAddr source1;
  direct_or_indirect local_218;
  uint local_208;
  Network local_200;
  uint32_t uStack_1fc;
  uint16_t local_1f8;
  CAddress addr5;
  direct_or_indirect local_1b8;
  uint local_1a8;
  Network local_1a0;
  uint32_t uStack_19c;
  uint16_t local_198;
  CAddress addr4;
  direct_or_indirect local_158;
  uint local_148;
  Network local_140;
  uint32_t uStack_13c;
  uint16_t local_138;
  CAddress addr3;
  direct_or_indirect local_f8;
  uint local_e8;
  Network local_e0;
  uint32_t uStack_dc;
  uint16_t local_d8;
  CAddress addr2;
  direct_or_indirect local_98;
  uint local_88;
  Network local_80;
  uint32_t uStack_7c;
  uint16_t local_78;
  CAddress addr1;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x17d;
  file.m_begin = (iterator)&local_448;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg);
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cb0;
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  source1.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  addr5.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)&source1;
  addr3.super_CService.super_CNetAddr.m_addr._union.direct[0] =
       source1.m_addr._union.indirect_contents.indirect == (char *)0x0;
  local_410.indirect_contents.indirect = (char *)&source2;
  source2.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)(uint)source2.m_addr._union._4_4_ << 0x20);
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  addr4.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  addr4.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x5f;
  addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cf0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3d30;
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = &addr5;
  addr1.super_CService.super_CNetAddr._24_8_ = &local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr3,(lazy_ostream *)&addr2,1,2,REQUIRE,0xe7eaf6,(size_t)&addr4,
             0x17d,&addr,"0U",&addr1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&addr3.super_CService.super_CNetAddr.m_addr._size);
  pvVar14 = (iterator)0x0;
  pvVar15 = (iterator)0x1;
  AddrMan::GetAddr(&vAddr1,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17f;
  file_00.m_begin = (iterator)&local_480;
  msg_00.m_end = pvVar15;
  msg_00.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_490,
             msg_00);
  source1.m_addr._union.indirect_contents.indirect =
       (char *)(((long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  addr5.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)&source1;
  addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cf0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_410.indirect_contents.indirect = (char *)&source2;
  addr2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cb0;
  addr2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  source2.m_addr._union.indirect_contents.indirect =
       (char *)((ulong)source2.m_addr._union.indirect_contents.indirect & 0xffffffff00000000);
  addr1.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr3.super_CService.super_CNetAddr.m_addr._union.direct[0] =
       vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
       super__Vector_impl_data._M_start;
  addr3.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr3.super_CService.super_CNetAddr.m_addr._size = 0;
  addr3.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3d30;
  addr1.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr4.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  addr4.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x5f;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  addr.super_CService.super_CNetAddr._24_8_ = &addr5;
  addr1.super_CService.super_CNetAddr._24_8_ = &local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr3,(lazy_ostream *)&addr2,1,2,REQUIRE,0xe7f5d2,(size_t)&addr4,
             0x17f,&addr,"0U",&addr1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&addr3.super_CService.super_CNetAddr.m_addr._size);
  psVar2 = &addr.super_CService.super_CNetAddr.m_addr._size;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"250.250.2.1","");
  ResolveService((CService *)&local_98.indirect_contents,(string *)&addr,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents);
  addr1.super_CService.super_CNetAddr.m_net = local_80;
  addr1.super_CService.super_CNetAddr.m_scope_id = uStack_7c;
  addr1.super_CService.port = local_78;
  addr1.nTime.__d.__r = (duration)100000000;
  addr1.nServices = NODE_NONE;
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  tVar8 = NodeClock::now();
  addr1.nTime.__d.__r = (duration)((long)tVar8.__d.__r / 1000000000);
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"250.251.2.2","");
  ResolveService((CService *)&local_f8.indirect_contents,(string *)&addr,9999);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  addr2.super_CService.super_CNetAddr.m_net = local_e0;
  addr2.super_CService.super_CNetAddr.m_scope_id = uStack_dc;
  addr2.super_CService.port = local_d8;
  addr2.nTime.__d.__r = (duration)100000000;
  addr2.nServices = NODE_NONE;
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  tVar8 = NodeClock::now();
  addr2.nTime.__d.__r = (duration)((long)tVar8.__d.__r / 1000000000);
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"251.252.2.3","");
  ResolveService((CService *)&local_158.indirect_contents,(string *)&addr,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_158.indirect_contents);
  addr3.super_CService.super_CNetAddr.m_net = local_140;
  addr3.super_CService.super_CNetAddr.m_scope_id = uStack_13c;
  addr3.super_CService.port = local_138;
  addr3.nTime.__d.__r = (duration)100000000;
  addr3.nServices = NODE_NONE;
  if (0x10 < local_148) {
    free(local_158.indirect_contents.indirect);
    local_158.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  tVar8 = NodeClock::now();
  addr3.nTime.__d.__r = (duration)((long)tVar8.__d.__r / 1000000000);
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"252.253.3.4","");
  ResolveService((CService *)&local_1b8.indirect_contents,(string *)&addr,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr4,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1b8.indirect_contents);
  addr4.super_CService.super_CNetAddr.m_net = local_1a0;
  addr4.super_CService.super_CNetAddr.m_scope_id = uStack_19c;
  addr4.super_CService.port = local_198;
  addr4.nTime.__d.__r = (duration)100000000;
  addr4.nServices = NODE_NONE;
  if (0x10 < local_1a8) {
    free(local_1b8.indirect_contents.indirect);
    local_1b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  tVar8 = NodeClock::now();
  addr4.nTime.__d.__r = (duration)((long)tVar8.__d.__r / 1000000000);
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"252.254.4.5","");
  ResolveService((CService *)&local_218.indirect_contents,(string *)&addr,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr5,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_218.indirect_contents);
  addr5.super_CService.super_CNetAddr.m_net = local_200;
  addr5.super_CService.super_CNetAddr.m_scope_id = uStack_1fc;
  addr5.super_CService.port = local_1f8;
  addr5.nTime.__d.__r = (duration)100000000;
  addr5.nServices = NODE_NONE;
  if (0x10 < local_208) {
    free(local_218.indirect_contents.indirect);
    local_218.indirect_contents.indirect = (char *)0x0;
  }
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  tVar8 = NodeClock::now();
  addr5.nTime.__d.__r = (duration)((long)tVar8.__d.__r / 1000000000);
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"250.1.2.1","");
  ResolveIP(&source1,(string *)&addr);
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"250.2.3.3","");
  ResolveIP(&source2,(string *)&addr);
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar2) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
  }
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x18f;
  file_01.m_begin = (iterator)&local_4a0;
  msg_01.m_end = pvVar15;
  msg_01.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_4b0,
             msg_01);
  _Var6 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  addr.super_CService.super_CNetAddr.m_net = addr1.super_CService.super_CNetAddr.m_net;
  addr.super_CService.super_CNetAddr.m_scope_id = addr1.super_CService.super_CNetAddr.m_scope_id;
  addr.super_CService.port = addr1.super_CService.port;
  addr.nTime = addr1.nTime;
  addr.nServices = addr1.nServices;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_2c8,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr3);
  local_2b0 = addr3.super_CService.super_CNetAddr.m_net;
  uStack_2ac = addr3.super_CService.super_CNetAddr.m_scope_id;
  local_2a8 = addr3.super_CService.port;
  local_2a0 = addr3.nTime.__d.__r;
  SStack_298 = addr3.nServices;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_290,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr5);
  local_278 = addr5.super_CService.super_CNetAddr.m_net;
  uStack_274 = addr5.super_CService.super_CNetAddr.m_scope_id;
  local_270 = addr5.super_CService.port;
  local_268 = addr5.nTime.__d.__r;
  SStack_260 = addr5.nServices;
  __l._M_len = 3;
  __l._M_array = &addr;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390,__l,(allocator_type *)&octet1
            );
  _cVar18 = 0x22e167;
  bVar7 = AddrMan::Add((AddrMan *)
                       _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_390,&source1,
                       (seconds)0x0);
  strAddr._M_dataplus._M_p._0_1_ = bVar7;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1a1346;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7f65c;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4b8 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_400._8_8_ = &vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)&local_410,1,0,WARN,_cVar18,
             (size_t)&local_4c0,399);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390);
  lVar17 = 0x70;
  do {
    if (0x10 < *(uint *)((long)&addr.super_CService.super_CNetAddr.m_addr._size + lVar17)) {
      free(*(void **)((long)&addr.super_CService.super_CNetAddr.m_addr._union + lVar17));
      *(undefined8 *)((long)&addr.super_CService.super_CNetAddr.m_addr._union + lVar17) = 0;
    }
    lVar17 = lVar17 + -0x38;
  } while (lVar17 != -0x38);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x190;
  file_02.m_begin = (iterator)&local_4d0;
  msg_02.m_end = pvVar15;
  msg_02.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4e0,
             msg_02);
  _Var6 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  addr.super_CService.super_CNetAddr.m_net = addr2.super_CService.super_CNetAddr.m_net;
  addr.super_CService.super_CNetAddr.m_scope_id = addr2.super_CService.super_CNetAddr.m_scope_id;
  addr.super_CService.port = addr2.super_CService.port;
  addr.nTime = addr2.nTime;
  addr.nServices = addr2.nServices;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_2c8,(prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr4);
  local_2b0 = addr4.super_CService.super_CNetAddr.m_net;
  uStack_2ac = addr4.super_CService.super_CNetAddr.m_scope_id;
  local_2a8 = addr4.super_CService.port;
  local_2a0 = addr4.nTime.__d.__r;
  SStack_298 = addr4.nServices;
  __l_00._M_len = 2;
  __l_00._M_array = &addr;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390,__l_00,
             (allocator_type *)&octet1);
  _cVar18 = 0x22e342;
  bVar7 = AddrMan::Add((AddrMan *)
                       _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_390,&source2,
                       (seconds)0x0);
  strAddr._M_dataplus._M_p._0_1_ = bVar7;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1a1361;
  vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe7f682;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4e8 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_400._8_8_ = &vAddr;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)&local_410,1,0,WARN,_cVar18,
             (size_t)&local_4f0,400);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_390);
  lVar17 = 0x38;
  do {
    if (0x10 < *(uint *)((long)&addr.super_CService.super_CNetAddr.m_addr._size + lVar17)) {
      free(*(void **)((long)&addr.super_CService.super_CNetAddr.m_addr._union + lVar17));
      *(undefined8 *)((long)&addr.super_CService.super_CNetAddr.m_addr._union + lVar17) = 0;
    }
    lVar17 = lVar17 + -0x38;
  } while (lVar17 != -0x38);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x192;
  file_03.m_begin = (iterator)&local_500;
  msg_03.m_end = pvVar15;
  msg_03.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_510,
             msg_03);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  _octet2 = &percent23;
  local_430 = &local_600;
  local_600._0_4_ = 5;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  addr.super_CService.super_CNetAddr._24_8_ = &octet2;
  addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cf0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_400._8_8_ = &local_430;
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7f683,
             (size_t)&octet1,0x192,&addr,"5U",(lazy_ostream *)&local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x194;
  file_04.m_begin = (iterator)&local_528;
  msg_04.m_end = pvVar15;
  msg_04.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_538,
             msg_04);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_600 = CONCAT44(local_600._4_4_,1);
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x38;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  _octet2 = &percent23;
  addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cf0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = &octet2;
  local_430 = &local_600;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_400._8_8_ = &local_430;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7f6b0,
             (size_t)&octet1,0x194,&addr,"1U",(lazy_ostream *)&local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x197;
  file_05.m_begin = (iterator)&local_548;
  msg_05.m_end = pvVar15;
  msg_05.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_558,
             msg_05);
  _Var6 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_348.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  local_330 = addr1.super_CService.super_CNetAddr.m_net;
  uStack_32c = addr1.super_CService.super_CNetAddr.m_scope_id;
  local_328 = addr1.super_CService.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_348.indirect_contents);
  addr.super_CService.super_CNetAddr.m_net = local_330;
  addr.super_CService.super_CNetAddr.m_scope_id = uStack_32c;
  addr.super_CService.port = local_328;
  addr.nTime.__d.__r = (duration)100000000;
  addr.nServices = NODE_NONE;
  tVar8 = NodeClock::now();
  _cVar18 = 0x22e897;
  bVar7 = AddrMan::Good((AddrMan *)
                        _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                        (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
  strAddr._M_dataplus._M_p._0_1_ = bVar7;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  local_390._M_dataplus._M_p = "addrman->Good(CAddress(addr1, NODE_NONE))";
  local_390._M_string_length = 0xe7f597;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_560 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_400._8_8_ = &local_390;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)&local_410,1,0,WARN,_cVar18,
             (size_t)&local_568,0x197);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
    free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_338) {
    free(local_348.indirect_contents.indirect);
    local_348.indirect_contents.indirect = (char *)0x0;
  }
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x198;
  file_06.m_begin = (iterator)&local_578;
  msg_06.m_end = pvVar15;
  msg_06.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_588,
             msg_06);
  _Var6 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_370.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  local_358 = addr2.super_CService.super_CNetAddr.m_net;
  uStack_354 = addr2.super_CService.super_CNetAddr.m_scope_id;
  local_350 = addr2.super_CService.port;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_370.indirect_contents);
  addr.super_CService.super_CNetAddr.m_net = local_358;
  addr.super_CService.super_CNetAddr.m_scope_id = uStack_354;
  addr.super_CService.port = local_350;
  addr.nTime.__d.__r = (duration)100000000;
  addr.nServices = NODE_NONE;
  tVar8 = NodeClock::now();
  _cVar18 = 0x22ea55;
  bVar7 = AddrMan::Good((AddrMan *)
                        _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                        (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
  strAddr._M_dataplus._M_p._0_1_ = bVar7;
  strAddr._M_string_length = 0;
  strAddr.field_2._M_allocated_capacity = 0;
  local_390._M_dataplus._M_p = "addrman->Good(CAddress(addr2, NODE_NONE))";
  local_390._M_string_length = 0xe7f5c1;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3df0;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_590 = "";
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x0;
  local_400._8_8_ = &local_390;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&strAddr,(lazy_ostream *)&local_410,1,0,WARN,_cVar18,
             (size_t)&local_598,0x198);
  boost::detail::shared_count::~shared_count((shared_count *)&strAddr.field_2._M_allocated_capacity)
  ;
  if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
    free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_360) {
    free(local_370.indirect_contents.indirect);
    local_370.indirect_contents.indirect = (char *)0x0;
  }
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x199;
  file_07.m_begin = (iterator)&local_5a8;
  msg_07.m_end = pvVar15;
  msg_07.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5b8,
             msg_07);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_600._0_4_ = 5;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  _octet2 = &percent23;
  addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cf0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = &octet2;
  local_430 = &local_600;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar14 = (iterator)0x1;
  pvVar15 = (iterator)0x2;
  local_400._8_8_ = &local_430;
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7f683,
             (size_t)&octet1,0x199,&addr,"5U",(lazy_ostream *)&local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x19a;
  file_08.m_begin = (iterator)&local_5c8;
  msg_08.m_end = pvVar15;
  msg_08.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_5d8,
             msg_08);
  strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
  strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
  strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr(&vAddr,(AddrMan *)
                          addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>
                          ._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                   (optional<Network>)0x0,true);
  percent23 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_600 = CONCAT44(local_600._4_4_,1);
  local_390._M_dataplus._M_p._0_1_ =
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == 0x38;
  local_390._M_string_length = 0;
  local_390.field_2._M_allocated_capacity = 0;
  _octet1 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  _octet2 = &percent23;
  addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_013d3cf0;
  addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr.super_CService.super_CNetAddr._24_8_ = &octet2;
  local_430 = &local_600;
  local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
  local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  uVar16 = 1;
  local_400._8_8_ = &local_430;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7f6b0,
             (size_t)&octet1,0x19a,&addr,"1U",(lazy_ostream *)&local_410);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_390.field_2._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
  do {
    _octet1 = (char *)(CONCAT44(uStack_41c,uVar16) & 0xffffffff000000ff);
    _octet2 = (size_t *)CONCAT44(uStack_424,uVar16 >> 8);
    util::ToString<int>(&local_390,&octet1);
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_390,".");
    local_410.indirect_contents.indirect = (char *)&local_400;
    pp_Var4 = (_func_int **)(pbVar9->_M_dataplus)._M_p;
    paVar11 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pp_Var4 == paVar11) {
      local_400._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_400._8_8_ = *(long *)((long)&pbVar9->field_2 + 8);
    }
    else {
      local_400._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_410.indirect_contents.indirect = (char *)pp_Var4;
    }
    local_410._8_8_ = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    util::ToString<int>((string *)&vAddr,&octet2);
    uVar12 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.indirect_contents.indirect != &local_400) {
      uVar12 = local_400._M_allocated_capacity;
    }
    pCVar1 = (pointer)(((vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish)->super_CService).super_CNetAddr.m_addr.
                       _union.direct + local_410._8_8_);
    if ((ulong)uVar12 < pCVar1) {
      pCVar13 = (pointer)0xf;
      if (vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        pCVar13 = vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      }
      if (pCVar13 < pCVar1) goto LAB_0022efcc;
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((string *)&vAddr,0,0,local_410.indirect_contents.indirect,local_410._8_8_);
    }
    else {
LAB_0022efcc:
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_410,
                         (char *)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                         (size_type)
                         vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)&addr.super_CService.super_CNetAddr.m_addr._size;
    pcVar5 = (pbVar9->_M_dataplus)._M_p;
    paVar11 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 == paVar11) {
      addr.super_CService.super_CNetAddr.m_addr._16_8_ = paVar11->_M_allocated_capacity;
      addr.super_CService.super_CNetAddr._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    }
    else {
      addr.super_CService.super_CNetAddr.m_addr._16_8_ = paVar11->_M_allocated_capacity;
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = pcVar5;
    }
    addr.super_CService.super_CNetAddr.m_addr._union._8_8_ = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar9->_M_string_length = 0;
    paVar11->_M_local_buf[0] = '\0';
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                        ".1.23");
    strAddr._M_dataplus._M_p = (pointer)&strAddr.field_2;
    pcVar5 = (pbVar9->_M_dataplus)._M_p;
    paVar11 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 == paVar11) {
      strAddr.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      strAddr.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
    }
    else {
      strAddr.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      strAddr._M_dataplus._M_p = pcVar5;
    }
    strAddr._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        &addr.super_CService.super_CNetAddr.m_addr._size) {
      operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      addr.super_CService.super_CNetAddr.m_addr._16_8_ + 1);
    }
    if (vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)&((vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_CService).super_CNetAddr.m_addr._union + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410.indirect_contents.indirect != &local_400) {
      operator_delete(local_410.indirect_contents.indirect,
                      (ulong)(local_400._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    ResolveService((CService *)&local_3d8.indirect_contents,&strAddr,0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_3d8.indirect_contents);
    addr.super_CService.super_CNetAddr.m_net = local_3c0;
    addr.super_CService.super_CNetAddr.m_scope_id = uStack_3bc;
    addr.super_CService.port = local_3b8;
    addr.nTime.__d.__r = (duration)100000000;
    addr.nServices = NODE_NONE;
    if (0x10 < local_3c8) {
      free(local_3d8.indirect_contents.indirect);
      local_3d8.indirect_contents.indirect = (char *)0x0;
    }
    tVar8 = NodeClock::now();
    _Var6 = addrman;
    addr.nTime.__d.__r = (duration)((long)tVar8.__d.__r / 1000000000);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_410,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
    local_400._8_4_ = addr.super_CService.super_CNetAddr.m_net;
    local_400._12_4_ = addr.super_CService.super_CNetAddr.m_scope_id;
    local_3f0 = addr.super_CService.port;
    local_3e8 = (NodeSeconds)(NodeSeconds)addr.nTime.__d.__r;
    SStack_3e0 = addr.nServices;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_410;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              (&vAddr,__l_01,(allocator_type *)&local_430);
    ResolveIP((CNetAddr *)&local_390,&strAddr);
    AddrMan::Add((AddrMan *)
                 _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr,(CNetAddr *)&local_390,
                 (seconds)0x0);
    if (0x10 < (uint)local_390.field_2._M_allocated_capacity._0_4_) {
      free(local_390._M_dataplus._M_p);
      local_390._M_dataplus._M_p = (pointer)0x0;
    }
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
    if (0x10 < (uint)local_400._M_allocated_capacity._0_4_) {
      free(local_410.indirect_contents.indirect);
      local_410.indirect_contents.indirect = (char *)0x0;
    }
    _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
         addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
         super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
         super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
    if ((uVar16 & 7) == 0) {
      tVar8 = NodeClock::now();
      AddrMan::Good((AddrMan *)
                    _Var6._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                    (NodeSeconds)((long)tVar8.__d.__r / 1000000000));
    }
    if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
      free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strAddr._M_dataplus._M_p != &strAddr.field_2) {
      operator_delete(strAddr._M_dataplus._M_p,strAddr.field_2._M_allocated_capacity + 1);
    }
    uVar16 = uVar16 + 1;
    if (uVar16 == 0x800) {
      pvVar14 = (iterator)0x0;
      pvVar15 = (iterator)0x1;
      AddrMan::GetAddr(&vAddr,(AddrMan *)
                              addrman._M_t.
                              super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                              super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                              super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0x9c4,0x17,
                       (optional<Network>)0x0,true);
      sVar10 = AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
      percent23 = (sVar10 * 0x17) / 100;
      local_5e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_5e0 = "";
      local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_09.m_end = (iterator)0x1ac;
      file_09.m_begin = (iterator)&local_5e8;
      msg_09.m_end = pvVar15;
      msg_09.m_begin = pvVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5f8,
                 msg_09);
      strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
      strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
      strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_600 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      local_390._M_string_length = 0;
      local_390.field_2._M_allocated_capacity = 0;
      _octet1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_418 = "";
      _octet2 = &local_600;
      addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)&PTR__lazy_ostream_013d3cf0;
      addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
      addr.super_CService.super_CNetAddr._24_8_ = &octet2;
      local_430 = &percent23;
      local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
      local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3cf0;
      local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_400._8_8_ = &local_430;
      pvVar14 = (iterator)0x1;
      pvVar15 = (iterator)0x2;
      local_390._M_dataplus._M_p._0_1_ = local_600 - percent23 == 0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7f6e7,
                 (size_t)&octet1,0x1ac,&addr,"percent23",&local_410);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_390.field_2._M_allocated_capacity);
      local_610 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_608 = "";
      local_620 = &boost::unit_test::basic_cstring<char_const>::null;
      local_618 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x1ad;
      file_10.m_begin = (iterator)&local_610;
      msg_10.m_end = pvVar15;
      msg_10.m_begin = pvVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_620,
                 msg_10);
      strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
      strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
      strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_600 = ((long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      local_390._M_dataplus._M_p._0_1_ =
           (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)vAddr.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start == 0x64d8;
      local_624 = 0x1cd;
      local_390._M_string_length = 0;
      local_390.field_2._M_allocated_capacity = 0;
      _octet1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_418 = "";
      _octet2 = &local_600;
      addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)&PTR__lazy_ostream_013d3cf0;
      addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
      addr.super_CService.super_CNetAddr._24_8_ = &octet2;
      local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
      local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
      local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_400._8_8_ = &local_430;
      pvVar14 = (iterator)0x1;
      pvVar15 = (iterator)0x2;
      local_430 = (size_t *)&local_624;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7f6e7,
                 (size_t)&octet1,0x1ad,&addr,"461U",&local_410);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_390.field_2._M_allocated_capacity);
      local_638 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_630 = "";
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      local_640 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x1af;
      file_11.m_begin = (iterator)&local_638;
      msg_11.m_end = pvVar15;
      msg_11.m_begin = pvVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_648,
                 msg_11);
      strAddr._M_string_length = strAddr._M_string_length & 0xffffffffffffff00;
      strAddr._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
      strAddr.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      strAddr.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_600 = AddrMan::Size((AddrMan *)
                                addrman._M_t.
                                super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                (optional<Network>)0x0,(optional<bool>)0x0);
      local_624 = 0x7d6;
      local_390._M_dataplus._M_p._0_1_ = local_600 == 0x7d6;
      local_390._M_string_length = 0;
      local_390.field_2._M_allocated_capacity = 0;
      _octet1 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_418 = "";
      _octet2 = &local_600;
      addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           addr.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           (char *)&PTR__lazy_ostream_013d3cf0;
      addr.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
      addr.super_CService.super_CNetAddr._24_8_ = &octet2;
      local_410._8_8_ = local_410._8_8_ & 0xffffffffffffff00;
      local_410.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
      local_400._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_400._8_8_ = &local_430;
      local_430 = (size_t *)&local_624;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_390,(lazy_ostream *)&strAddr,1,2,REQUIRE,0xe7eaf6,
                 (size_t)&octet1,0x1af,&addr,"2006U",&local_410);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_390.field_2._M_allocated_capacity);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr);
      if (0x10 < source2.m_addr._size) {
        free(source2.m_addr._union.indirect_contents.indirect);
        source2.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < source1.m_addr._size) {
        free(source1.m_addr._union.indirect_contents.indirect);
        source1.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr5.super_CService.super_CNetAddr.m_addr._size) {
        free(addr5.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr5.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr4.super_CService.super_CNetAddr.m_addr._size) {
        free(addr4.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr4.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr3.super_CService.super_CNetAddr.m_addr._size) {
        free(addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr3.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr2.super_CService.super_CNetAddr.m_addr._size) {
        free(addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < addr1.super_CService.super_CNetAddr.m_addr._size) {
        free(addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
        addr1.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
      }
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr1);
      std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_getaddr)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Test: Sanity check, GetAddr should never return anything if addrman
    //  is empty.
    BOOST_CHECK_EQUAL(addrman->Size(), 0U);
    std::vector<CAddress> vAddr1 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr1.size(), 0U);

    CAddress addr1 = CAddress(ResolveService("250.250.2.1", 8333), NODE_NONE);
    addr1.nTime = Now<NodeSeconds>(); // Set time so isTerrible = false
    CAddress addr2 = CAddress(ResolveService("250.251.2.2", 9999), NODE_NONE);
    addr2.nTime = Now<NodeSeconds>();
    CAddress addr3 = CAddress(ResolveService("251.252.2.3", 8333), NODE_NONE);
    addr3.nTime = Now<NodeSeconds>();
    CAddress addr4 = CAddress(ResolveService("252.253.3.4", 8333), NODE_NONE);
    addr4.nTime = Now<NodeSeconds>();
    CAddress addr5 = CAddress(ResolveService("252.254.4.5", 8333), NODE_NONE);
    addr5.nTime = Now<NodeSeconds>();
    CNetAddr source1 = ResolveIP("250.1.2.1");
    CNetAddr source2 = ResolveIP("250.2.3.3");

    // Test: Ensure GetAddr works with new addresses.
    BOOST_CHECK(addrman->Add({addr1, addr3, addr5}, source1));
    BOOST_CHECK(addrman->Add({addr2, addr4}, source2));

    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 5U);
    // Net processing asks for 23% of addresses. 23% of 5 is 1 rounded down.
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt).size(), 1U);

    // Test: Ensure GetAddr works with new and tried addresses.
    BOOST_CHECK(addrman->Good(CAddress(addr1, NODE_NONE)));
    BOOST_CHECK(addrman->Good(CAddress(addr2, NODE_NONE)));
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 5U);
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt).size(), 1U);

    // Test: Ensure GetAddr still returns 23% when addrman has many addrs.
    for (unsigned int i = 1; i < (8 * 256); i++) {
        int octet1 = i % 256;
        int octet2 = i >> 8 % 256;
        std::string strAddr = ToString(octet1) + "." + ToString(octet2) + ".1.23";
        CAddress addr = CAddress(ResolveService(strAddr), NODE_NONE);

        // Ensure that for all addrs in addrman, isTerrible == false.
        addr.nTime = Now<NodeSeconds>();
        addrman->Add({addr}, ResolveIP(strAddr));
        if (i % 8 == 0)
            addrman->Good(addr);
    }
    std::vector<CAddress> vAddr = addrman->GetAddr(/*max_addresses=*/2500, /*max_pct=*/23, /*network=*/std::nullopt);

    size_t percent23 = (addrman->Size() * 23) / 100;
    BOOST_CHECK_EQUAL(vAddr.size(), percent23);
    BOOST_CHECK_EQUAL(vAddr.size(), 461U);
    // (addrman.Size() < number of addresses added) due to address collisions.
    BOOST_CHECK_EQUAL(addrman->Size(), 2006U);
}